

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::toString_abi_cxx11_(Catch *this,int value)

{
  ostream *this_00;
  void *this_01;
  ostringstream local_190 [8];
  ostringstream oss;
  int value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (value < 0x2001) {
    std::ostream::operator<<(local_190,value);
  }
  else {
    this_00 = std::operator<<((ostream *)local_190,"0x");
    this_01 = (void *)std::ostream::operator<<(this_00,std::hex);
    std::ostream::operator<<(this_01,value);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

std::string toString( int value ) {
    std::ostringstream oss;
    if( value > 8192 )
        oss << "0x" << std::hex << value;
    else
        oss << value;
    return oss.str();
}